

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImg<unsigned_char>::CImg
          (CImg<unsigned_char> *this,CImg<unsigned_char> *img,bool is_shared)

{
  uint uVar1;
  void *pvVar2;
  byte in_DL;
  CImg<unsigned_char> *in_RSI;
  uint *in_RDI;
  uint siz;
  
  uVar1 = size(in_RSI);
  if ((in_RSI->_data == (uchar *)0x0) || (uVar1 == 0)) {
    in_RDI[3] = 0;
    in_RDI[2] = 0;
    in_RDI[1] = 0;
    *in_RDI = 0;
    *(undefined1 *)(in_RDI + 4) = 0;
    in_RDI[6] = 0;
    in_RDI[7] = 0;
  }
  else {
    *in_RDI = in_RSI->_width;
    in_RDI[1] = in_RSI->_height;
    in_RDI[2] = in_RSI->_depth;
    in_RDI[3] = in_RSI->_spectrum;
    *(byte *)(in_RDI + 4) = in_DL & 1;
    if ((in_RDI[4] & 1) == 0) {
      pvVar2 = operator_new__((ulong)uVar1);
      *(void **)(in_RDI + 6) = pvVar2;
      memcpy(*(void **)(in_RDI + 6),in_RSI->_data,(ulong)uVar1);
    }
    else {
      *(uchar **)(in_RDI + 6) = in_RSI->_data;
    }
  }
  return;
}

Assistant:

CImg(const CImg<T>& img, const bool is_shared) {
      const unsigned int siz = img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum; _is_shared = is_shared;
        if (_is_shared) _data = const_cast<T*>(img._data);
        else {
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "CImg() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(img._width*img._height*img._depth*img._spectrum*sizeof(T)),
                                        img._width,img._height,img._depth,img._spectrum);
          }
          std::memcpy(_data,img._data,siz*sizeof(T));
        }
      } else { _width = _height = _depth = _spectrum = 0; _is_shared = false; _data = 0; }
    }